

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<float>(uint length,float value)

{
  undefined8 *puVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint i;
  uint uVar10;
  float *pfVar11;
  ulong uVar12;
  undefined8 *puVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  long lVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  ulong uVar18;
  ulong uVar19;
  float *local_48;
  shared_ptr<float> pa;
  shared_ptr<float> pb;
  
  pfVar11 = nosimd::common::malloc<float>(length + 1);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)&local_48,pfVar11,
             nosimd::common::free<float>);
  pfVar11 = nosimd::common::malloc<float>(length + 1);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pfVar11,
             nosimd::common::free<float>);
  uVar19 = (ulong)length;
  local_48[uVar19] = 127.0;
  *(undefined4 *)
   ((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar19 * 4) = 0x427c0000;
  pfVar11 = local_48;
  for (uVar10 = length; 0xf < (int)uVar10; uVar10 = uVar10 - 0x10) {
    *pfVar11 = value;
    pfVar11[1] = value;
    pfVar11[2] = value;
    pfVar11[3] = value;
    pfVar11[4] = value;
    pfVar11[5] = value;
    pfVar11[6] = value;
    pfVar11[7] = value;
    pfVar11[8] = value;
    pfVar11[9] = value;
    pfVar11[10] = value;
    pfVar11[0xb] = value;
    pfVar11[0xc] = value;
    pfVar11[0xd] = value;
    pfVar11[0xe] = value;
    pfVar11[0xf] = value;
    pfVar11 = pfVar11 + 0x10;
  }
  if (7 < (int)uVar10) {
    *pfVar11 = value;
    pfVar11[1] = value;
    pfVar11[2] = value;
    pfVar11[3] = value;
    pfVar11[4] = value;
    pfVar11[5] = value;
    pfVar11[6] = value;
    pfVar11[7] = value;
    uVar10 = uVar10 - 8;
    pfVar11 = pfVar11 + 8;
  }
  if (3 < (int)uVar10) {
    *pfVar11 = value;
    pfVar11[1] = value;
    pfVar11[2] = value;
    pfVar11[3] = value;
    uVar10 = uVar10 - 4;
    pfVar11 = pfVar11 + 4;
  }
  for (; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
    *pfVar11 = value;
    pfVar11 = pfVar11 + 1;
  }
  uVar12 = 0;
  while (uVar19 != uVar12) {
    pfVar11 = local_48 + uVar12;
    uVar12 = uVar12 + 1;
    if ((*pfVar11 != value) || (NAN(*pfVar11) || NAN(value))) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar13 = "void test_common(unsigned int, T) [T = float]";
      *(undefined4 *)(puVar13 + 1) = 0x16;
      *(uint *)((long)puVar13 + 0xc) = length;
      __cxa_throw(puVar13,&Exception::typeinfo,0);
    }
  }
  lVar15 = 0;
  for (uVar10 = length; 7 < (int)uVar10; uVar10 = uVar10 - 8) {
    uVar3 = ((undefined8 *)((long)local_48 + lVar15))[1];
    puVar13 = (undefined8 *)((long)local_48 + lVar15 + 0x10);
    uVar4 = *puVar13;
    uVar5 = puVar13[1];
    puVar13 = (undefined8 *)
              ((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar15);
    *puVar13 = *(undefined8 *)((long)local_48 + lVar15);
    puVar13[1] = uVar3;
    puVar13 = (undefined8 *)
              ((long)&pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                      _vptr__Sp_counted_base + lVar15);
    *puVar13 = uVar4;
    puVar13[1] = uVar5;
    lVar15 = lVar15 + 0x20;
  }
  if ((int)uVar10 < 4) {
    puVar13 = (undefined8 *)
              ((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar15);
    puVar17 = (undefined8 *)(lVar15 + (long)local_48);
  }
  else {
    puVar1 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar15);
    puVar13 = puVar1 + 2;
    puVar16 = (undefined8 *)(lVar15 + (long)local_48);
    puVar17 = puVar16 + 2;
    uVar3 = puVar16[1];
    *puVar1 = *puVar16;
    puVar1[1] = uVar3;
    uVar10 = uVar10 - 4;
  }
  lVar15 = 0;
  for (; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
    *(undefined4 *)((long)puVar13 + lVar15) = *(undefined4 *)((long)puVar17 + lVar15);
    lVar15 = lVar15 + 4;
  }
  uVar12 = 0;
  while (uVar19 != uVar12) {
    fVar2 = *(float *)((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
    uVar12 = uVar12 + 1;
    if ((fVar2 != value) || (NAN(fVar2) || NAN(value))) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar13 = "void test_common(unsigned int, T) [T = float]";
      *(undefined4 *)(puVar13 + 1) = 0x1d;
      *(uint *)((long)puVar13 + 0xc) = length;
      __cxa_throw(puVar13,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<float>
            ((float *)pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar12 = 0;
  while (uVar19 != uVar12) {
    fVar2 = *(float *)((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
    uVar12 = uVar12 + 1;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar13 = "void test_common(unsigned int, T) [T = float]";
      *(undefined4 *)(puVar13 + 1) = 0x24;
      *(uint *)((long)puVar13 + 0xc) = length;
      __cxa_throw(puVar13,&Exception::typeinfo,0);
    }
  }
  for (uVar12 = 0; _Var14 = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
      pfVar11 = local_48, uVar10 = length, uVar19 != uVar12; uVar12 = uVar12 + 1) {
    local_48[uVar12] = (float)(uVar12 & 0xffffffff);
  }
  for (; 7 < (int)uVar10; uVar10 = uVar10 - 8) {
    fVar2 = pfVar11[2];
    fVar7 = pfVar11[3];
    pp_Var6 = *(_func_int ***)(pfVar11 + 4);
    fVar8 = pfVar11[6];
    fVar9 = pfVar11[7];
    (_Var14._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)pfVar11;
    (_Var14._M_pi)->_M_use_count = (_Atomic_word)fVar2;
    (_Var14._M_pi)->_M_weak_count = (_Atomic_word)fVar7;
    _Var14._M_pi[1]._vptr__Sp_counted_base = pp_Var6;
    _Var14._M_pi[1]._M_use_count = (_Atomic_word)fVar8;
    _Var14._M_pi[1]._M_weak_count = (_Atomic_word)fVar9;
    _Var14._M_pi = _Var14._M_pi + 2;
    pfVar11 = pfVar11 + 8;
  }
  if (3 < (int)uVar10) {
    fVar2 = pfVar11[2];
    fVar7 = pfVar11[3];
    (_Var14._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)pfVar11;
    (_Var14._M_pi)->_M_use_count = (_Atomic_word)fVar2;
    (_Var14._M_pi)->_M_weak_count = (_Atomic_word)fVar7;
    uVar10 = uVar10 - 4;
    pfVar11 = pfVar11 + 4;
    _Var14._M_pi = _Var14._M_pi + 1;
  }
  lVar15 = 0;
  for (; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
    *(undefined4 *)((long)&(_Var14._M_pi)->_vptr__Sp_counted_base + lVar15) =
         *(undefined4 *)((long)pfVar11 + lVar15);
    lVar15 = lVar15 + 4;
  }
  uVar12 = 0;
  while (uVar19 != uVar12) {
    uVar18 = uVar12 & 0xffffffff;
    fVar2 = *(float *)((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
    uVar12 = uVar12 + 1;
    if ((fVar2 != (float)uVar18) || (NAN(fVar2) || NAN((float)uVar18))) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar13 = "void test_common(unsigned int, T) [T = float]";
      *(undefined4 *)(puVar13 + 1) = 0x2d;
      *(uint *)((long)puVar13 + 0xc) = length;
      __cxa_throw(puVar13,&Exception::typeinfo,0);
    }
  }
  if ((((local_48[uVar19] == 127.0) && (!NAN(local_48[uVar19]))) &&
      (fVar2 = *(float *)((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar19 * 4),
      fVar2 == 63.0)) && (!NAN(fVar2))) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar13 = "void test_common(unsigned int, T) [T = float]";
  *(undefined4 *)(puVar13 + 1) = 0x31;
  *(uint *)((long)puVar13 + 0xc) = length;
  __cxa_throw(puVar13,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}